

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_timer_thread_stats.cpp
# Opt level: O3

void __thiscall
so_5::stats::impl::ds_timer_thread_stats_t::distribute
          (ds_timer_thread_stats_t *this,mbox_t *distribution_mbox)

{
  int iVar1;
  undefined4 extraout_var;
  timer_thread_stats_t stats;
  suffix_t local_68;
  unsigned_long local_60;
  unsigned_long local_58;
  prefix_t local_50;
  
  iVar1 = (*this->m_what->_vptr_environment_infrastructure_t[0xe])();
  local_60 = CONCAT44(extraout_var,iVar1);
  prefixes::timer_thread();
  local_68 = suffixes::timer_single_shot_count();
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t,so_5::stats::suffix_t,unsigned_long_const&>
            (distribution_mbox,&local_50,&local_68,&local_60);
  prefixes::timer_thread();
  local_68 = suffixes::timer_periodic_count();
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t,so_5::stats::suffix_t,unsigned_long_const&>
            (distribution_mbox,&local_50,&local_68,&local_58);
  return;
}

Assistant:

void
ds_timer_thread_stats_t::distribute(
	const mbox_t & distribution_mbox )
	{
		const auto stats = m_what.query_timer_thread_stats();

		send< messages::quantity< std::size_t > >( distribution_mbox,
				prefixes::timer_thread(),
				suffixes::timer_single_shot_count(),
				stats.m_single_shot_count );

		send< messages::quantity< std::size_t > >( distribution_mbox,
				prefixes::timer_thread(),
				suffixes::timer_periodic_count(),
				stats.m_periodic_count );
	}